

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

LispPTR COM_closefile(LispPTR *args)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar6;
  int *piVar7;
  char cVar8;
  DLword *pDVar9;
  uint uVar10;
  long lVar11;
  timespec timesp [2];
  stat sbuf;
  char host [255];
  char lfname [4101];
  char file [4096];
  timespec local_21f8;
  long local_21e8;
  undefined8 local_21e0;
  stat local_21d8;
  undefined4 local_2148;
  char local_2144;
  char local_2048 [4112];
  char local_1038 [4104];
  long lVar5;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar10 = args[3];
  if ((uVar10 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar10);
  }
  Lisp_errno = (int *)(Lisp_world + uVar10);
  uVar10 = *args;
  if ((uVar10 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar10);
  }
  if ((char)Lisp_world[(ulong)uVar10 + 3] == 'D') {
    iVar2 = *(int *)(Lisp_world + (ulong)uVar10 + 4) * 2 + 5;
  }
  else {
    if ((char)Lisp_world[(ulong)uVar10 + 3] != 'C') {
      error("LispStringLength: Not a character array.\n");
      goto LAB_0011caa8;
    }
    iVar2 = *(int *)(Lisp_world + (ulong)uVar10 + 4) + 3;
  }
  if (0x1005 < iVar2) {
    *Lisp_errno = 200;
    return 0;
  }
LAB_0011caa8:
  uVar10 = *args;
  if ((uVar10 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar10);
  }
  iVar2 = *(int *)(Lisp_world + (ulong)uVar10 + 4);
  iVar3 = 0x1000;
  if (iVar2 < 0x1000) {
    iVar3 = iVar2;
  }
  lVar5 = (long)iVar3;
  if ((char)Lisp_world[(ulong)uVar10 + 3] == 'D') {
    if (iVar2 == 0) {
      pcVar6 = local_2048;
    }
    else {
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      pDVar9 = Lisp_world +
               (ulong)Lisp_world[(ulong)uVar10 + 2] +
               (ulong)(*(uint *)(Lisp_world + uVar10) & 0xfffffff);
      pcVar6 = local_2048;
      do {
        *pcVar6 = *(char *)((ulong)pDVar9 ^ 2);
        pcVar6 = pcVar6 + 1;
        pDVar9 = pDVar9 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    *pcVar6 = '\0';
  }
  else if ((char)Lisp_world[(ulong)uVar10 + 3] == 'C') {
    if (iVar2 != 0) {
      uVar4 = *(uint *)(Lisp_world + uVar10);
      uVar1 = Lisp_world[(ulong)uVar10 + 2];
      lVar11 = 0;
      do {
        local_2048[lVar11] =
             *(char *)((long)Lisp_world + lVar11 + (ulong)uVar1 + (ulong)(uVar4 & 0xfffffff) * 2 ^ 3
                      );
        lVar11 = lVar11 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar11);
    }
    local_2048[lVar5] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  separate_host(local_2048,(char *)&local_2148);
  if ((char)local_2148 != '\0') {
    pcVar6 = (char *)((long)&local_2148 + 1);
    cVar8 = (char)local_2148;
    do {
      if ((byte)(cVar8 + 0x9fU) < 0x1a) {
        pcVar6[-1] = cVar8 + -0x20;
      }
      cVar8 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar8 != '\0');
  }
  iVar2 = 1;
  if ((local_2148 != 0x4b5344) && (iVar2 = 0, local_2144 != '\0' || local_2148 != 0x58494e55)) {
    return 0;
  }
  unixpathname(local_2048,local_1038,iVar2,0);
  uVar10 = args[1];
  if ((uVar10 & 0xfff0000) == 0xf0000) {
    uVar10 = uVar10 | 0xffff0000;
  }
  else if ((uVar10 & 0xfff0000) == 0xe0000) {
    uVar10 = uVar10 & 0xffff;
  }
  else {
    if ((uVar10 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar10);
    }
    uVar10 = *(uint *)(Lisp_world + uVar10);
  }
  uVar4 = args[2];
  if ((uVar4 & 0xfff0000) == 0xf0000) {
    uVar4 = uVar4 | 0xffff0000;
  }
  else if ((uVar4 & 0xfff0000) == 0xe0000) {
    uVar4 = uVar4 & 0xffff;
  }
  else {
    if ((uVar4 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    }
    uVar4 = *(uint *)(Lisp_world + uVar4);
  }
  if (local_2148 == 0x4b5344) {
LAB_0011cd32:
    if (uVar4 == 0) {
      alarm(TIMEOUT_TIME);
      piVar7 = __errno_location();
      while( true ) {
        *piVar7 = 0;
        iVar2 = close(uVar10);
        if (iVar2 != -1) break;
        if (*piVar7 != 4) {
          alarm(0);
          if ((*piVar7 == 1 && local_2148 != 0x4b5344) && ((local_21d8.st_mode & 0xf000) != 0x8000))
          {
            return 0x4c;
          }
          *Lisp_errno = *piVar7;
          return 0;
        }
      }
LAB_0011ce73:
      alarm(0);
      return 0x4c;
    }
    local_21f8.tv_sec = local_21d8.st_atim.tv_sec;
    local_21f8.tv_nsec = 0;
    local_21e8 = (long)(int)(uVar4 + 0xfe36b500);
    local_21e0 = 0;
    alarm(TIMEOUT_TIME);
    piVar7 = __errno_location();
    while( true ) {
      *piVar7 = 0;
      iVar2 = futimens(uVar10,&local_21f8);
      if (iVar2 != -1) break;
      if (*piVar7 != 4) {
        alarm(0);
LAB_0011ce2f:
        *Lisp_errno = *piVar7;
        return 0;
      }
    }
    alarm(0);
    if (iVar2 != 0) goto LAB_0011ce2f;
    alarm(TIMEOUT_TIME);
    do {
      *piVar7 = 0;
      iVar2 = close(uVar10);
      if (iVar2 != -1) goto LAB_0011ce73;
    } while (*piVar7 == 4);
    alarm(0);
    iVar2 = *piVar7;
  }
  else {
    alarm(TIMEOUT_TIME);
    piVar7 = __errno_location();
    do {
      *piVar7 = 0;
      iVar2 = fstat(uVar10,&local_21d8);
      if (iVar2 != -1) {
        alarm(0);
        goto LAB_0011cd32;
      }
    } while (*piVar7 == 4);
    alarm(0);
    iVar2 = *piVar7;
  }
  *Lisp_errno = iVar2;
  return 0;
}

Assistant:

LispPTR COM_closefile(LispPTR *args)
{
#ifdef DOS

  int fd, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN], dir[MAXPATHLEN], name[MAXNAMLEN + 1];
  char ver[VERSIONLEN], drive[1];
  struct find_t dirp;
  int dp;
  struct stat sbuf;
  ino_t ino;
  int extlen;
  char rawname[MAXNAMLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, dskp);

  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = dskp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host, drive);

  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0, drive, &extlen, rawname)
       : unixpathname(lfname, file, 0, 0, drive, &extlen, rawname);
  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);
  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  if (!unpack_filename(file, dir, name, ver, 1)) return (NIL);

  if (dskp) {
    /*
     * On {DSK}, we have to make sure dir is case sensitively existing
     * directory.
     */
    if (true_name(dir) != -1) return (NIL);

    /*
     * There is a very troublesome problem here.  The file name Lisp
     * recognizes is not always the same as the name which COM_openfile
     * used to open the file.  Sometimes COM_openfile uses the versionless
     * file name to open a file, although Lisp always recognizes with
     * *versioned* file name.
     * Thus, we compare i-node number of the requested file with ones of all
     * of files on the directory.   This is time spending implementation.
     * More clean up work is needed.
     */
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
    ino = sbuf.st_ino;
    TIMEOUT(rval = _dos_findfirst(dir, _A_SUBDIR, &dirp));
    if (rval < 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

    for (; rval == 0; S_TOUT(rval = _dos_findnext(&dirp))) {
      sprintf(file, "%s\\%s", dir, dirp.name);
    }
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  time[0].tv_sec = (long)sbuf.st_atime;
  time[0].tv_usec = 0L;
  time[1].tv_sec = (long)ToUnixTime(cdate);
  time[1].tv_usec = 0L;
#endif /* DOS */
  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }
#ifndef DOS /* effectively NEVER, since we're in an ifdef DOS */
  TIMEOUT(rval = utimes(file, time));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }
#endif /* DOS, internal */
#else  /* UNIX version of CLOSEFILE */
  int fd, fatp, dskp, rval;
  time_t cdate;
  char lfname[MAXPATHLEN + 5], host[MAXNAMLEN];
  char file[MAXPATHLEN];
  struct stat sbuf;
  struct timespec timesp[2];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  /* Add five for the host name field in Lisp format. */
  if (rval > MAXPATHLEN + 5) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

  separate_host(lfname, host);
  UPCASE(host);
  if (strcmp(host, "DSK") == 0)
    dskp = 1;
  else if (strcmp(host, "UNIX") == 0)
    dskp = 0;
  else
    return (NIL);

  /*
   * Convert a Lisp file name to UNIX one.  If host is DSK, we also have to
   * convert a version field.
   */
  dskp ? unixpathname(lfname, file, 1, 0) : unixpathname(lfname, file, 0, 0);

  fd = LispNumToCInt(args[1]);
  cdate = (time_t)LispNumToCInt(args[2]);

  if (!dskp) {
    TIMEOUT(rval = fstat(fd, &sbuf));
    if (rval == -1) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }

  if (cdate == 0) {
    /* Just close. */
    TIMEOUT(rval = close(fd));
    if (rval == -1) {
      if (!dskp && errno == EPERM && !S_ISREG(sbuf.st_mode)) {
        /*
         * On {UNIX} device, closing a special file we are not
         * the owner of it.  Although I don't think close fails
         * because of EPERM, in honor of Medley 1.1 code, I put
         * this segment here.
         */
        return (ATOM_T);
      } else {
        *Lisp_errno = errno;
        return (NIL);
      }
    } else {
      return (ATOM_T);
    }
  }

  /* introduction of futimens() allows us to set the times on an open
   * file descriptor so a lot of directory manipulation to find the
   * appropriate name associated with the inode is no longer required
   */

  timesp[0].tv_sec = (long)sbuf.st_atime;
  timesp[0].tv_nsec = 0L;
  timesp[1].tv_sec = (long)ToUnixTime(cdate);
  timesp[1].tv_nsec = 0L;

  TIMEOUT(rval = futimens(fd, timesp));
  if (rval != 0) {
    *Lisp_errno = errno;
    return (NIL);
  }

  TIMEOUT(rval = close(fd));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

#endif /* DOS */

  return (ATOM_T);
}